

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O2

Builder * embree::avx::BVH8BuilderTwoLevelTriangle4MeshSAH
                    (void *bvh,Scene *scene,bool useMortonBuilder)

{
  BVHNBuilderTwoLevel<8,_embree::TriangleMesh,_embree::TriangleM<4>_> *this;
  
  this = (BVHNBuilderTwoLevel<8,_embree::TriangleMesh,_embree::TriangleM<4>_> *)::operator_new(0xa8)
  ;
  BVHNBuilderTwoLevel<8,_embree::TriangleMesh,_embree::TriangleM<4>_>::BVHNBuilderTwoLevel
            (this,(BVH *)bvh,scene,MTY_TRIANGLE_MESH,useMortonBuilder,0x400);
  return (Builder *)this;
}

Assistant:

Builder* BVH8BuilderTwoLevelTriangle4MeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,TriangleMesh,Triangle4>((BVH8*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }